

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::dropEvent(QGraphicsView *this,QDropEvent *event)

{
  bool bVar1;
  QGraphicsViewPrivate *pQVar2;
  QObject *pQVar3;
  long *in_RSI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QGraphicsSceneDragDropEvent sceneEvent;
  QGraphicsSceneDragDropEvent *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  Type type;
  QGraphicsSceneDragDropEvent *in_stack_ffffffffffffffc0;
  long *plVar4;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  type = (Type)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsView *)0xa3cf9a);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa3cfb0);
  if ((bVar1) && ((*(uint *)&pQVar2->field_0x300 & 1) != 0)) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent(in_stack_ffffffffffffffc0,type);
    QGraphicsViewPrivate::populateSceneDragDropEvent
              ((QGraphicsViewPrivate *)this,(QGraphicsSceneDragDropEvent *)event,(QDropEvent *)d);
    pQVar3 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3d026)->
              super_QObject;
    QCoreApplication::sendEvent(pQVar3,(QEvent *)&local_20);
    plVar4 = in_RSI;
    bVar1 = QEvent::isAccepted((QEvent *)&local_20);
    (**(code **)(*plVar4 + 0x10))(plVar4,bVar1);
    bVar1 = QEvent::isAccepted((QEvent *)&local_20);
    if (bVar1) {
      QGraphicsSceneDragDropEvent::dropAction(in_stack_ffffffffffffffb0);
      QDropEvent::setDropAction((DropAction)in_RSI);
    }
    if (pQVar2->lastDragDropEvent != (QGraphicsSceneDragDropEvent *)0x0) {
      (**(code **)(*(long *)&pQVar2->lastDragDropEvent->super_QGraphicsSceneEvent + 8))();
    }
    pQVar2->lastDragDropEvent = (QGraphicsSceneDragDropEvent *)0x0;
    QGraphicsSceneDragDropEvent::~QGraphicsSceneDragDropEvent
              ((QGraphicsSceneDragDropEvent *)0xa3d0c9);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsView::dropEvent(QDropEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;

    // Generate a scene event.
    QGraphicsSceneDragDropEvent sceneEvent(QEvent::GraphicsSceneDrop);
    d->populateSceneDragDropEvent(&sceneEvent, event);

    // Send it to the scene.
    QCoreApplication::sendEvent(d->scene, &sceneEvent);

    // Accept the originating event if the scene accepted the scene event.
    event->setAccepted(sceneEvent.isAccepted());
    if (sceneEvent.isAccepted())
        event->setDropAction(sceneEvent.dropAction());

    delete d->lastDragDropEvent;
    d->lastDragDropEvent = nullptr;
}